

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = internal::AllAreInitialized<google::protobuf::DescriptorProto>(&this->message_type_);
  if ((((bVar1) &&
       (bVar1 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>
                          (&this->enum_type_), bVar1)) &&
      (bVar1 = internal::AllAreInitialized<google::protobuf::ServiceDescriptorProto>
                         (&this->service_), bVar1)) &&
     ((bVar1 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>
                         (&this->extension_), bVar1 &&
      ((bVar1 = _internal_has_options(this), !bVar1 ||
       (bVar1 = FileOptions::IsInitialized(this->options_), bVar1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(message_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(enum_type_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(service_)) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(extension_)) return false;
  if (_internal_has_options()) {
    if (!options_->IsInitialized()) return false;
  }
  return true;
}